

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track>
GTrackWithSectors<FMEncoder>
          (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
           *sectors,size_t post_index_address_mark_bytes,uint8_t post_index_address_mark_value,
          size_t pre_address_mark_bytes,size_t post_address_mark_bytes,
          uint8_t post_address_mark_value,size_t pre_data_mark_bytes,size_t post_data_bytes,
          uint8_t post_data_value,size_t expected_track_bytes)

{
  Sector *pSVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  ulong __new_size;
  size_type sVar6;
  reference ppSVar7;
  const_reference pvVar8;
  reference pvVar9;
  byte *pbVar10;
  const_reference pvVar11;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000089;
  shared_ptr<Storage::Disk::Track> sVar12;
  undefined7 in_stack_00000019;
  ulong in_stack_00000028;
  undefined1 local_388 [24];
  size_t c_5;
  byte local_362;
  byte local_361;
  uint8_t fuzzy_mask;
  const_iterator cStack_360;
  uint8_t value;
  const_iterator sample_iterator;
  size_t declared_length;
  size_t c_4;
  size_t c_3;
  size_t c_2;
  size_t c_1;
  Sector *sector_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *__range1_1;
  size_t c;
  size_t size;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *__range1;
  size_t total_sector_bytes;
  size_t max_size;
  size_t mark_size;
  size_t data_size;
  FMEncoder shifter;
  undefined1 local_90 [8];
  PCMSegment segment;
  size_t post_address_mark_bytes_local;
  size_t pre_address_mark_bytes_local;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *pvStack_20;
  uint8_t post_index_address_mark_value_local;
  size_t post_index_address_mark_bytes_local;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *sectors_local;
  
  pvStack_20 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                *)CONCAT71(in_register_00000011,post_index_address_mark_value);
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)CONCAT71(in_register_00000089,post_address_mark_value);
  Storage::Disk::PCMSegment::PCMSegment((PCMSegment *)local_90);
  std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)&segment,in_stack_00000028 << 3);
  FMEncoder::FMEncoder
            ((FMEncoder *)&data_size,(vector<bool,_std::allocator<bool>_> *)&segment,
             (vector<bool,_std::allocator<bool>_> *)0x0);
  sVar4 = FMEncoder::item_size((FMEncoder *)&data_size,Data);
  sVar5 = FMEncoder::item_size((FMEncoder *)&data_size,Mark);
  __new_size = (in_stack_00000028 + in_stack_00000028 / 10) * 8;
  __range1 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
              *)0x0;
  __end1 = std::
           vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
           ::begin((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                    *)post_index_address_mark_bytes);
  sector = (Sector *)
           std::
           vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
           ::end((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                  *)post_index_address_mark_bytes);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Storage::Encodings::MFM::Sector_*const_*,_std::vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>_>
                                     *)&sector),
        post_address_mark_bytes_local = post_address_mark_bytes, bVar3) {
    ppSVar7 = __gnu_cxx::
              __normal_iterator<const_Storage::Encodings::MFM::Sector_*const_*,_std::vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>_>
              ::operator*(&__end1);
    __range1 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                *)((long)&(__range1->
                          super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                          )._M_impl.super__Vector_impl_data._M_start +
                  (long)(0x80 << ((*ppSVar7)->size & 0x1f)) + 2);
    __gnu_cxx::
    __normal_iterator<const_Storage::Encodings::MFM::Sector_*const_*,_std::vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>_>
    ::operator++(&__end1);
  }
  for (; (sVar6 = std::
                  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                  ::size((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                          *)post_index_address_mark_bytes),
         __new_size <=
         (sVar5 + (long)pvStack_20 * sVar4 + (long)__range1 * sVar4 +
         sVar6 * (((long)segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage +
                  _post_data_value + post_data_bytes + post_address_mark_bytes_local + 6) * sVar4 +
                 sVar5 * 2)) * 8 &&
         ((((pvStack_20 !=
             (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
              *)0x0 || (post_address_mark_bytes_local != 0)) ||
           (segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage != (_Bit_pointer)0x0)) ||
          ((post_data_bytes != 0 || (_post_data_value != 0))))));
      _post_data_value = _post_data_value >> 1) {
    pvStack_20 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                  *)((ulong)pvStack_20 >> 1);
    post_address_mark_bytes_local = post_address_mark_bytes_local >> 1;
    segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage =
         (_Bit_pointer)
         ((ulong)segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage >> 1);
    post_data_bytes = post_data_bytes >> 1;
  }
  FMEncoder::add_index_address_mark((FMEncoder *)&data_size);
  for (__range1_1 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                     *)0x0; __range1_1 < pvStack_20;
      __range1_1 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                    *)((long)&(__range1_1->
                              super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1)) {
    FMEncoder::add_byte((FMEncoder *)&data_size,(uint8_t)pre_address_mark_bytes,'\0');
  }
  __end1_1 = std::
             vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
             ::begin((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                      *)post_index_address_mark_bytes);
  sector_1 = (Sector *)
             std::
             vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
             ::end((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                    *)post_index_address_mark_bytes);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Storage::Encodings::MFM::Sector_*const_*,_std::vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>_>
                             *)&sector_1), bVar3) {
    ppSVar7 = __gnu_cxx::
              __normal_iterator<const_Storage::Encodings::MFM::Sector_*const_*,_std::vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>_>
              ::operator*(&__end1_1);
    pSVar1 = *ppSVar7;
    for (c_2 = 0; c_2 < post_address_mark_bytes_local; c_2 = c_2 + 1) {
      FMEncoder::add_byte((FMEncoder *)&data_size,'\0','\0');
    }
    FMEncoder::add_ID_address_mark((FMEncoder *)&data_size);
    FMEncoder::add_byte((FMEncoder *)&data_size,(pSVar1->address).track,'\0');
    FMEncoder::add_byte((FMEncoder *)&data_size,(pSVar1->address).side,'\0');
    FMEncoder::add_byte((FMEncoder *)&data_size,(pSVar1->address).sector,'\0');
    FMEncoder::add_byte((FMEncoder *)&data_size,pSVar1->size,'\0');
    Storage::Encodings::MFM::Encoder::add_crc
              ((Encoder *)&data_size,(bool)(pSVar1->has_header_crc_error & 1));
    for (c_3 = 0; c_3 < segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage; c_3 = c_3 + 1) {
      FMEncoder::add_byte((FMEncoder *)&data_size,(uint8_t)pre_data_mark_bytes,'\0');
    }
    for (c_4 = 0; c_4 < post_data_bytes; c_4 = c_4 + 1) {
      FMEncoder::add_byte((FMEncoder *)&data_size,'\0','\0');
    }
    bVar3 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::empty(&pSVar1->samples);
    if (!bVar3) {
      if ((pSVar1->is_deleted & 1U) == 0) {
        FMEncoder::add_data_address_mark((FMEncoder *)&data_size);
      }
      else {
        FMEncoder::add_deleted_data_address_mark((FMEncoder *)&data_size);
      }
      sample_iterator._M_current =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           (long)(0x80 << (pSVar1->size & 0x1f));
      sVar6 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::size(&pSVar1->samples);
      if (sVar6 < 2) {
        declared_length = 0;
        while( true ) {
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar1->samples,0);
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar8);
          if (sVar6 <= declared_length || sample_iterator._M_current <= declared_length) break;
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar1->samples,0);
          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar8,declared_length);
          FMEncoder::add_byte((FMEncoder *)&data_size,*pvVar11,'\0');
          declared_length = declared_length + 1;
        }
      }
      else {
        declared_length = 0;
        while( true ) {
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar1->samples,0);
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar8);
          if (sVar6 <= declared_length || sample_iterator._M_current <= declared_length) break;
          cStack_360 = std::
                       vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::begin(&pSVar1->samples);
          pvVar9 = __gnu_cxx::
                   __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::operator*(&stack0xfffffffffffffca0);
          pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar9,declared_length);
          local_361 = *pbVar10;
          local_362 = 0;
          __gnu_cxx::
          __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator++(&stack0xfffffffffffffca0);
          while( true ) {
            c_5 = (size_t)std::
                          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::end(&pSVar1->samples);
            bVar3 = __gnu_cxx::operator!=
                              (&stack0xfffffffffffffca0,
                               (__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                *)&c_5);
            bVar2 = local_361;
            if (!bVar3) break;
            pvVar9 = __gnu_cxx::
                     __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ::operator*(&stack0xfffffffffffffca0);
            pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (pvVar9,declared_length);
            local_362 = local_362 | bVar2 ^ *pbVar10;
            local_361 = local_361 & (local_362 ^ 0xff);
            __gnu_cxx::
            __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::operator++(&stack0xfffffffffffffca0);
          }
          pvVar8 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator[](&pSVar1->samples,0);
          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar8,declared_length);
          FMEncoder::add_byte((FMEncoder *)&data_size,*pvVar11,local_362);
          declared_length = declared_length + 1;
        }
      }
      for (; declared_length < sample_iterator._M_current; declared_length = declared_length + 1) {
        FMEncoder::add_byte((FMEncoder *)&data_size,'\0','\0');
      }
      Storage::Encodings::MFM::Encoder::add_crc
                ((Encoder *)&data_size,(bool)(pSVar1->has_data_crc_error & 1));
    }
    for (local_388._16_8_ = 0; (ulong)local_388._16_8_ < _post_data_value;
        local_388._16_8_ = local_388._16_8_ + 1) {
      FMEncoder::add_byte((FMEncoder *)&data_size,(uint8_t)expected_track_bytes,'\0');
    }
    __gnu_cxx::
    __normal_iterator<const_Storage::Encodings::MFM::Sector_*const_*,_std::vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>_>
    ::operator++(&__end1_1);
  }
  while (sVar6 = std::vector<bool,_std::allocator<bool>_>::size
                           ((vector<bool,_std::allocator<bool>_> *)&segment),
        sVar6 < in_stack_00000028 << 3) {
    FMEncoder::add_byte((FMEncoder *)&data_size,'\0','\0');
  }
  sVar6 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)&segment);
  if (__new_size < sVar6) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)&segment,__new_size,false);
  }
  std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment>((PCMSegment *)local_388);
  std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
            ((shared_ptr<Storage::Disk::Track> *)sectors,
             (shared_ptr<Storage::Disk::PCMTrack> *)local_388);
  std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
            ((shared_ptr<Storage::Disk::PCMTrack> *)local_388);
  FMEncoder::~FMEncoder((FMEncoder *)&data_size);
  Storage::Disk::PCMSegment::~PCMSegment((PCMSegment *)local_90);
  sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sectors;
  return (shared_ptr<Storage::Disk::Track>)
         sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Storage::Disk::Track>
		GTrackWithSectors(
			const std::vector<const Sector *> &sectors,
			std::size_t post_index_address_mark_bytes, uint8_t post_index_address_mark_value,
			std::size_t pre_address_mark_bytes,
			std::size_t post_address_mark_bytes, uint8_t post_address_mark_value,
			std::size_t pre_data_mark_bytes,
			std::size_t post_data_bytes, uint8_t post_data_value,
			std::size_t expected_track_bytes) {
	Storage::Disk::PCMSegment segment;
	segment.data.reserve(expected_track_bytes * 8);
	T shifter(segment.data);

	// Make a pre-estimate of output size, in case any of the idealised gaps
	// provided need to be shortened.
	const size_t data_size = shifter.item_size(SurfaceItem::Data);
	const size_t mark_size = shifter.item_size(SurfaceItem::Mark);
	const size_t max_size = (expected_track_bytes + (expected_track_bytes / 10)) * 8;

	size_t total_sector_bytes = 0;
	for(const auto sector : sectors) {
		total_sector_bytes += size_t(128 << sector->size) + 2;
	}

	// Seek appropriate gap sizes, if the defaults don't allow all data to fit.
	while(true) {
		const size_t size =
			mark_size +
			post_index_address_mark_bytes * data_size +
			total_sector_bytes * data_size +
			sectors.size() * (
				(pre_address_mark_bytes + 6 + post_address_mark_bytes + pre_data_mark_bytes + post_data_bytes) * data_size + 2 * mark_size
			);

		// If this track already fits, do nothing.
		if(size*8 < max_size) break;

		// If all gaps are already zero, do nothing.
		if(!post_index_address_mark_bytes && !pre_address_mark_bytes && !post_address_mark_bytes && !pre_data_mark_bytes && !post_data_bytes)
			break;

		// Very simple solution: try halving all gaps.
		post_index_address_mark_bytes >>= 1;
		pre_address_mark_bytes >>= 1;
		post_address_mark_bytes >>= 1;
		pre_data_mark_bytes >>= 1;
		post_data_bytes >>= 1;
	}

	// Output the index mark.
	shifter.add_index_address_mark();

	// Add the post-index mark.
	for(std::size_t c = 0; c < post_index_address_mark_bytes; c++) shifter.add_byte(post_index_address_mark_value);

	// Add sectors.
	for(const Sector *sector : sectors) {
		// Gap.
		for(std::size_t c = 0; c < pre_address_mark_bytes; c++) shifter.add_byte(0x00);

		// Sector header.
		shifter.add_ID_address_mark();
		shifter.add_byte(sector->address.track);
		shifter.add_byte(sector->address.side);
		shifter.add_byte(sector->address.sector);
		shifter.add_byte(sector->size);
		shifter.add_crc(sector->has_header_crc_error);

		// Gap.
		for(std::size_t c = 0; c < post_address_mark_bytes; c++) shifter.add_byte(post_address_mark_value);
		for(std::size_t c = 0; c < pre_data_mark_bytes; c++) shifter.add_byte(0x00);

		// Data, if attached.
		if(!sector->samples.empty()) {
			if(sector->is_deleted)
				shifter.add_deleted_data_address_mark();
			else
				shifter.add_data_address_mark();

			std::size_t c = 0;
			std::size_t declared_length = size_t(128 << sector->size);
			if(sector->samples.size() > 1) {
				// For each byte, mark as fuzzy any bits that differ. Which isn't exactly the
				// same thing as obeying the multiple samples, as it discards the implied
				// probabilities of different values.
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					auto sample_iterator = sector->samples.begin();
					uint8_t value = (*sample_iterator)[c], fuzzy_mask = 0;

					++sample_iterator;
					while(sample_iterator != sector->samples.end()) {
						// Mark as fuzzy any bits that differ here from the
						// canonical value, and zero them out in the original.
						// That might cause them to retrigger, but who cares?
						fuzzy_mask |= value ^ (*sample_iterator)[c];
						value &= ~fuzzy_mask;

						++sample_iterator;
					}
					shifter.add_byte(sector->samples[0][c], fuzzy_mask);
				}
			} else {
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					shifter.add_byte(sector->samples[0][c]);
				}
			}
			for(; c < declared_length; c++) {
				shifter.add_byte(0x00);
			}
			shifter.add_crc(sector->has_data_crc_error);
		}

		// Gap.
		for(std::size_t c = 0; c < post_data_bytes; c++) shifter.add_byte(post_data_value);
	}

	while(segment.data.size() < expected_track_bytes*8) shifter.add_byte(0x00);

	// Allow the amount of data written to be up to 10% more than the expected size. Which is generous.
	if(segment.data.size() > max_size) segment.data.resize(max_size);

	return std::make_shared<Storage::Disk::PCMTrack>(std::move(segment));
}